

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsByteCodeWriter.cpp
# Opt level: O2

bool __thiscall
Js::WasmByteCodeWriter::TryWriteAsmCall<Js::LayoutSizePolicy<(Js::LayoutSize)0>>
          (WasmByteCodeWriter *this,OpCodeAsmJs op,RegSlot returnValueRegister,
          RegSlot functionRegister,ArgSlot givenArgCount,AsmJsRetType retType)

{
  Which WVar1;
  undefined8 in_RAX;
  AsmJsRetType local_28;
  undefined1 local_24;
  undefined1 local_23 [3];
  AsmJsRetType retType_local;
  OpLayoutT_AsmCall<Js::LayoutSizePolicy<(Js::LayoutSize)0>_> layout;
  
  if (((DAT_0143bfdd == '\0') && (DAT_0143bfdc == '\0')) &&
     ((int)(char)returnValueRegister == returnValueRegister)) {
    local_23[2] = (undefined1)((ulong)in_RAX >> 0x38);
    if (functionRegister < 0x100) {
      _local_28 = CONCAT35(CONCAT12(local_23[2],
                                    CONCAT11((char)functionRegister,(char)returnValueRegister)),
                           CONCAT14((char)givenArgCount,retType.which_));
      if (((givenArgCount < 0x100) && (WVar1 = AsmJsRetType::which(&local_28), DAT_0143bfdd == '\0')
          ) && (DAT_0143bfdc == '\0')) {
        _local_28 = CONCAT17((char)WVar1,_local_28);
        ByteCodeWriter::Data::EncodeT<(Js::LayoutSize)0>
                  (&(this->super_ByteCodeWriter).m_byteCodeData,op,&local_24,4,
                   &this->super_ByteCodeWriter,false);
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool AsmJsByteCodeWriter::TryWriteAsmCall(OpCodeAsmJs op, RegSlot returnValueRegister, RegSlot functionRegister, ArgSlot givenArgCount, AsmJsRetType retType)
    {
        OpLayoutT_AsmCall<SizePolicy> layout;
        if (SizePolicy::Assign(layout.Return, returnValueRegister) && SizePolicy::Assign(layout.Function, functionRegister)
            && SizePolicy::Assign(layout.ArgCount, givenArgCount) && SizePolicy::template Assign<int8>(layout.ReturnType, (int8)retType.which()))
        {
            m_byteCodeData.EncodeT<SizePolicy::LayoutEnum>(op, &layout, sizeof(layout), this);
            return true;
        }
        return false;
    }